

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datetimeparser.cpp
# Opt level: O0

int __thiscall QtMWidgets::Section::maxWidth(Section *this,QStyleOption *opt)

{
  Type TVar1;
  int iVar2;
  QStyleOption *pQVar3;
  QString local_110;
  QRect local_f8;
  QString local_e8;
  QRect local_d0;
  QString local_c0;
  QRect local_a8;
  QString local_98;
  QRect local_7c [2];
  QTime local_5c;
  QDate local_58;
  QDateTime local_50 [8];
  QString local_48;
  QRect local_2c;
  int local_1c;
  QStyleOption *pQStack_18;
  int width;
  QStyleOption *opt_local;
  Section *this_local;
  
  pQStack_18 = opt;
  opt_local = (QStyleOption *)this;
  QDate::QDate(&local_58,7999,0xc,0x1f);
  QTime::QTime(&local_5c,0x17,0x3b,0x3b,999);
  QDateTime::QDateTime(local_50,(QDate *)local_58.jd,(QTime *)(ulong)(uint)local_5c.mds,LocalTime,0)
  ;
  value(&local_48,this,local_50);
  local_2c = (QRect)QFontMetrics::boundingRect((QString *)(opt + 0x20));
  iVar2 = QRect::width(&local_2c);
  QString::~QString(&local_48);
  QDateTime::~QDateTime(local_50);
  local_1c = iVar2;
  iVar2 = QFontMetrics::averageCharWidth();
  local_1c = local_1c + iVar2 / 3;
  TVar1 = this->type;
  if (TVar1 == DaySectionShort) {
    pQVar3 = pQStack_18 + 0x20;
    maxShortDay(&local_98,pQStack_18);
    local_7c[0] = (QRect)QFontMetrics::boundingRect((QString *)pQVar3);
    iVar2 = QRect::width(local_7c);
    local_1c = iVar2 + local_1c;
    QString::~QString(&local_98);
    iVar2 = QFontMetrics::averageCharWidth();
    local_1c = iVar2 + local_1c;
  }
  else if (TVar1 == DaySectionLong) {
    pQVar3 = pQStack_18 + 0x20;
    maxLongDay(&local_c0,pQStack_18);
    local_a8 = (QRect)QFontMetrics::boundingRect((QString *)pQVar3);
    iVar2 = QRect::width(&local_a8);
    local_1c = iVar2 + local_1c;
    QString::~QString(&local_c0);
    iVar2 = QFontMetrics::averageCharWidth();
    local_1c = iVar2 + local_1c;
  }
  else if (TVar1 == MonthSectionShort) {
    pQVar3 = pQStack_18 + 0x20;
    maxShortMonth(&local_e8,pQStack_18);
    local_d0 = (QRect)QFontMetrics::boundingRect((QString *)pQVar3);
    iVar2 = QRect::width(&local_d0);
    local_1c = iVar2 + local_1c;
    QString::~QString(&local_e8);
  }
  else if (TVar1 == MonthSectionLong) {
    pQVar3 = pQStack_18 + 0x20;
    maxLongMonth(&local_110,pQStack_18);
    local_f8 = (QRect)QFontMetrics::boundingRect((QString *)pQVar3);
    iVar2 = QRect::width(&local_f8);
    local_1c = iVar2 + local_1c;
    QString::~QString(&local_110);
  }
  return local_1c;
}

Assistant:

int
Section::maxWidth( const QStyleOption & opt ) const
{
	int width = opt.fontMetrics.boundingRect( value(
		DATETIMEPICKER_DATETIME_MAX ) ).width();

	width += opt.fontMetrics.averageCharWidth() / 3;

	switch( type )
	{
		case DaySectionShort :
		{
			width += opt.fontMetrics.boundingRect( maxShortDay( opt ) ).width();
			width += opt.fontMetrics.averageCharWidth();
		}
		break;

		case DaySectionLong :
		{
			width += opt.fontMetrics.boundingRect( maxLongDay( opt ) ).width();
			width += opt.fontMetrics.averageCharWidth();
		}
		break;

		case MonthSectionShort :
			width += opt.fontMetrics.boundingRect( maxShortMonth( opt ) ).width();
		break;

		case MonthSectionLong :
			width += opt.fontMetrics.boundingRect( maxLongMonth( opt ) ).width();
		break;

		default:
			break;
	}

	return width;
}